

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

void ptls_log__recalc_point(int caller_locked,st_ptls_log_point_t *point)

{
  int iVar1;
  char **ppcVar2;
  size_t slot;
  long lVar3;
  uint32_t new_active;
  uint uVar4;
  
  if (caller_locked == 0) {
    pthread_mutex_lock((pthread_mutex_t *)&logctx.mutex);
  }
  if ((point->state).generation != ptls_log._generation) {
    uVar4 = 0;
    ppcVar2 = &logctx.conns[0].points;
    for (lVar3 = 0; lVar3 != 0x20; lVar3 = lVar3 + 1) {
      if (*ppcVar2 != (char *)0x0) {
        iVar1 = is_in_stringlist(*ppcVar2,point->name);
        if (iVar1 != 0) {
          uVar4 = uVar4 | 1 << ((uint)lVar3 & 0x1f);
        }
      }
      ppcVar2 = ppcVar2 + 5;
    }
    (point->state).active_conns = uVar4;
    (point->state).generation = ptls_log._generation;
  }
  if (caller_locked != 0) {
    return;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&logctx.mutex);
  return;
}

Assistant:

void ptls_log__recalc_point(int caller_locked, struct st_ptls_log_point_t *point)
{
    if (!caller_locked)
        pthread_mutex_lock(&logctx.mutex);

    if (point->state.generation != ptls_log._generation) {
        /* update active bitmap */
        uint32_t new_active = 0;
        for (size_t slot = 0; slot < PTLS_ELEMENTSOF(logctx.conns); ++slot)
            if (logctx.conns[slot].points != NULL && is_in_stringlist(logctx.conns[slot].points, point->name))
                new_active |= (uint32_t)1 << slot;
        point->state.active_conns = new_active;
        point->state.generation = ptls_log._generation;
    }

    if (!caller_locked)
        pthread_mutex_unlock(&logctx.mutex);
}